

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_11283::SolverDpllTriadSimd<1>::CountSolutionsConsistentWithPartialAssignment
          (SolverDpllTriadSimd<1> *this,State *state)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint band_idx;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  State *pSVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  State state_copy;
  undefined1 local_260 [16];
  uint local_244;
  State local_240;
  
  auVar11 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][0].configurations.vec);
  auVar12 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][1].configurations.vec);
  auVar13 = vpunpcklqdq_avx(auVar11,auVar12);
  auVar11 = vpunpckhqdq_avx(auVar11,auVar12);
  auVar11 = vpaddq_avx(auVar13,auVar11);
  auVar13 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][2].configurations.vec);
  auVar14 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][0].configurations.vec);
  auVar12 = vpunpcklqdq_avx(auVar13,auVar14);
  auVar13 = vpunpckhqdq_avx(auVar13,auVar14);
  auVar13 = vpaddq_avx(auVar12,auVar13);
  auVar12 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][1].configurations.vec);
  auVar15 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][2].configurations.vec);
  auVar14 = vpunpcklqdq_avx(auVar12,auVar15);
  auVar12 = vpunpckhqdq_avx(auVar12,auVar15);
  auVar12 = vpaddq_avx(auVar14,auVar12);
  auVar14 = vpcmpeqd_avx(auVar15,auVar15);
  auVar15._8_8_ = 0xf000e00040000;
  auVar15._0_8_ = 0xf000e00040000;
  auVar14 = vpermi2w_avx512vl(auVar15,auVar11,auVar14);
  auVar11 = vpmovsxbw_avx(ZEXT816(0x70600000c080100));
  auVar13 = vpermi2w_avx512vl(auVar11,auVar14,auVar13);
  auVar11 = vpmovsxbw_avx(ZEXT816(0x7060c0803020100));
  auVar11 = vpermi2w_avx512vl(auVar11,auVar13,auVar12);
  auVar13._8_2_ = 0xfff6;
  auVar13._0_8_ = 0xfff6fff6fff6fff6;
  auVar13._10_2_ = 0xfff6;
  auVar13._12_2_ = 0xfff6;
  auVar13._14_2_ = 0xfff6;
  auVar11 = vpaddw_avx(auVar11,auVar13);
  auVar11 = vphminposuw_avx(auVar11);
  if ((auVar11 & (undefined1  [16])0xff00) == (undefined1  [16])0x0) {
    (anonymous_namespace)::SolverDpllTriadSimd<1>::CountSolutionsConsistentWithPartialAssignment();
  }
  else {
    local_244 = 0xffffffff;
    local_240.bands[0][0].configurations.vec[0] = 0;
    local_240.bands[0][0].configurations.vec[1] = 0;
  }
  if (local_244 == 0xffffffff) {
    (anonymous_namespace)::solver_last._488_8_ = (anonymous_namespace)::solver_last._488_8_ + 1;
    if ((anonymous_namespace)::solver_last._488_8_ == (anonymous_namespace)::solver_last._480_8_) {
      memcpy((anonymous_namespace)::solver_last,this,0x1e0);
    }
  }
  else {
    (anonymous_namespace)::solver_last._496_8_ = (anonymous_namespace)::solver_last._496_8_ + 1;
    band_idx = *(uint *)((anonymous_namespace)::tables + (ulong)local_244 * 4 + 0x18dc);
    local_260._8_8_ = local_240.bands[0][0].configurations.vec[1];
    local_260._0_8_ = local_240.bands[0][0].configurations.vec[0];
    if (local_244 < 3) {
      auVar11 = *(undefined1 (*) [16])(this->solution_).bands[0][(int)band_idx].configurations.vec;
      bVar7 = false;
      lVar9 = 0;
      pSVar8 = &local_240;
      do {
        lVar10 = 0x10;
        do {
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar9 + -1][2].eliminations.vec + lVar10);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pSVar8->bands + -1) + 0x50 + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar9][0].configurations.vec + lVar10);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)pSVar8->bands[0][0].configurations.vec + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          lVar10 = lVar10 + 0x20;
        } while (lVar10 != 0x70);
        lVar9 = 1;
        bVar6 = !bVar7;
        bVar7 = true;
        pSVar8 = (State *)(local_240.bands + 1);
      } while (bVar6);
      memcpy(local_240.boxen,(this->solution_).boxen,0x120);
      auVar11 = vpand_avx(auVar11,local_260);
      uVar3 = vpcmpgtq_avx512vl(auVar11,(undefined1  [16])0x0);
      auVar13 = vpcmpgtq_avx(auVar11,(undefined1  [16])0x0);
      auVar13 = vpslldq_avx(auVar13,1);
      auVar4._8_8_ = 1;
      auVar4._0_8_ = 1;
      auVar13 = vandnpd_avx512vl(auVar13,auVar4);
      auVar13 = vpsubq_avx512vl(auVar11,auVar13);
      bVar7 = (bool)((byte)(uVar3 & 3) & 1);
      auVar16._0_8_ = (ulong)bVar7 * auVar13._0_8_ | (ulong)!bVar7 * auVar11._0_8_;
      uVar3 = (uVar3 & 3) >> 1;
      auVar16._8_8_ = uVar3 * auVar13._8_8_ | (ulong)!SUB81(uVar3,0) * auVar11._8_8_;
      auVar13 = vpand_avx(auVar16,auVar11);
      auVar12 = vpor_avx(auVar13,*(undefined1 (*) [16])
                                  local_240.bands[0][(int)band_idx].eliminations.vec);
      *(undefined1 (*) [16])local_240.bands[0][(int)band_idx].eliminations.vec = auVar12;
      pSVar8 = (State *)(ulong)band_idx;
      bVar7 = BandEliminate<0>(&local_240,band_idx,0);
      if ((bVar7) &&
         (CountSolutionsConsistentWithPartialAssignment((SolverDpllTriadSimd<1> *)&local_240,pSVar8)
         , (anonymous_namespace)::solver_last._488_8_ == (anonymous_namespace)::solver_last._480_8_)
         ) {
        return;
      }
      auVar11 = vpternlogq_avx512vl(auVar11,auVar13,
                                    *(undefined1 (*) [16])
                                     (this->solution_).bands[0][(int)band_idx].eliminations.vec,0xbe
                                   );
      *(undefined1 (*) [16])(this->solution_).bands[0][(int)band_idx].eliminations.vec = auVar11;
      pSVar8 = (State *)(ulong)band_idx;
      bVar7 = BandEliminate<0>(&this->solution_,band_idx,0);
    }
    else {
      auVar11 = *(undefined1 (*) [16])(this->solution_).boxen[(long)(int)band_idx + -3].cells.vec;
      bVar7 = false;
      lVar9 = 0;
      pSVar8 = &local_240;
      do {
        lVar10 = 0x10;
        do {
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar9 + -1][2].eliminations.vec + lVar10);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pSVar8->bands + -1) + 0x50 + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar9][0].configurations.vec + lVar10);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)pSVar8->bands[0][0].configurations.vec + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          lVar10 = lVar10 + 0x20;
        } while (lVar10 != 0x70);
        lVar9 = 1;
        bVar6 = !bVar7;
        bVar7 = true;
        pSVar8 = (State *)(local_240.bands + 1);
      } while (bVar6);
      memcpy(local_240.boxen,(this->solution_).boxen,0x120);
      auVar11 = vpand_avx(auVar11,local_260);
      uVar3 = vpcmpgtq_avx512vl(auVar11,(undefined1  [16])0x0);
      auVar13 = vpcmpgtq_avx(auVar11,(undefined1  [16])0x0);
      auVar13 = vpslldq_avx(auVar13,1);
      auVar12._8_8_ = 1;
      auVar12._0_8_ = 1;
      auVar13 = vandnpd_avx512vl(auVar13,auVar12);
      auVar13 = vpsubq_avx512vl(auVar11,auVar13);
      bVar7 = (bool)((byte)(uVar3 & 3) & 1);
      auVar14._0_8_ = (ulong)bVar7 * auVar13._0_8_ | (ulong)!bVar7 * auVar11._0_8_;
      uVar3 = (uVar3 & 3) >> 1;
      auVar14._8_8_ = uVar3 * auVar13._8_8_ | (ulong)!SUB81(uVar3,0) * auVar11._8_8_;
      auVar13 = vpand_avx(auVar14,auVar11);
      auVar12 = vpor_avx(auVar13,*(undefined1 (*) [16])
                                  (local_240.boxen[(long)(int)band_idx + -3].cells.vec + 2));
      *(undefined1 (*) [16])(local_240.boxen[(long)(int)band_idx + -3].cells.vec + 2) = auVar12;
      pSVar8 = (State *)(ulong)band_idx;
      bVar7 = BandEliminate<1>(&local_240,band_idx,0);
      if ((bVar7) &&
         (CountSolutionsConsistentWithPartialAssignment((SolverDpllTriadSimd<1> *)&local_240,pSVar8)
         , (anonymous_namespace)::solver_last._488_8_ == (anonymous_namespace)::solver_last._480_8_)
         ) {
        return;
      }
      auVar11 = vpternlogq_avx512vl(auVar11,auVar13,
                                    *(undefined1 (*) [16])
                                     ((this->solution_).boxen[(long)(int)band_idx + -3].cells.vec +
                                     2),0xbe);
      *(undefined1 (*) [16])((this->solution_).boxen[(long)(int)band_idx + -3].cells.vec + 2) =
           auVar11;
      pSVar8 = (State *)(ulong)band_idx;
      bVar7 = BandEliminate<1>(&this->solution_,band_idx,0);
    }
    if (bVar7 != false) {
      CountSolutionsConsistentWithPartialAssignment(this,pSVar8);
    }
  }
  return;
}

Assistant:

void CountSolutionsConsistentWithPartialAssignment(State &state) {
        auto band_and_value = ChooseBandAndValueToBranch(state);
        if (band_and_value.first == NONE) {
            num_solutions_++;
            if (solution_mode == 1 && num_solutions_ == limit_) solution_ = state;
            if (solution_mode == 2) ReportSolution(state);
        } else {
            if (band_and_value.first < 3) {
                BranchOnBandAndValue<0>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            } else {
                BranchOnBandAndValue<1>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            }
        }
    }